

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void add_linear_comb_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,double *res,double *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  double *in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  byte in_stack_00000028;
  size_t row_3;
  size_t ix;
  double currw;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  double mid_point;
  size_t row_2;
  size_t row_1;
  size_t row;
  vector<double,_std::allocator<double>_> obs_weight;
  double w_this;
  double cumw;
  double *res_write;
  size_t cnt_NA;
  size_t cnt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe68;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_fffffffffffffe70;
  long lVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  double local_148;
  byte local_129;
  ulong local_128;
  size_type local_120;
  double local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  double local_c8;
  undefined4 local_bc;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_70;
  double local_68;
  long local_60;
  ulong local_58;
  size_type local_50;
  byte local_41;
  double local_40;
  double *local_30;
  long local_28;
  ulong local_18;
  ulong local_10;
  long local_8;
  
  local_41 = in_stack_00000028 & 1;
  if (local_41 != 0) {
    *in_R9 = *in_R9 / in_XMM0_Qa;
  }
  local_50 = 0;
  local_58 = 0;
  local_60 = in_RCX + in_RSI * -8;
  local_68 = 0.0;
  local_40 = in_XMM1_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x25ca9a);
  if (((local_41 & 1) != 0) && (in_stack_00000010 != 0)) {
    local_90 = 0;
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (value_type_conflict *)in_stack_fffffffffffffe90._M_current);
  }
  if (in_stack_00000010 == 0) {
    for (local_a8 = local_10; local_a8 <= local_18; local_a8 = local_a8 + 1) {
      dVar6 = fma(*(double *)(local_28 + *(long *)(local_8 + local_a8 * 8) * 8) - local_40,*local_30
                  ,*(double *)(local_60 + local_a8 * 8));
      *(double *)(local_60 + local_a8 * 8) = dVar6;
    }
  }
  else {
    if ((local_41 & 1) == 0) {
      for (local_b8 = local_10; local_b8 <= local_18; local_b8 = local_b8 + 1) {
        uVar1 = std::isnan(*(double *)(local_28 + *(long *)(local_8 + local_b8 * 8) * 8));
        if (((uVar1 & 1) == 0) &&
           (uVar1 = std::isinf(*(double *)(local_28 + *(long *)(local_8 + local_b8 * 8) * 8)),
           (uVar1 & 1) == 0)) {
          local_148 = (*(double *)(local_28 + *(long *)(local_8 + local_b8 * 8) * 8) - local_40) *
                      *local_30;
        }
        else {
          local_148 = *in_stack_00000008;
        }
        *(double *)(local_60 + local_b8 * 8) = local_148 + *(double *)(local_60 + local_b8 * 8);
      }
      local_bc = 1;
      goto LAB_0025d2ed;
    }
    for (local_b0 = local_10; local_b0 <= local_18; local_b0 = local_b0 + 1) {
      uVar1 = std::isnan(*(double *)(local_28 + *(long *)(local_8 + local_b0 * 8) * 8));
      local_129 = 1;
      if ((uVar1 & 1) == 0) {
        iVar2 = std::isinf(*(double *)(local_28 + *(long *)(local_8 + local_b0 * 8) * 8));
        local_129 = (byte)iVar2;
      }
      if (((local_129 ^ 0xff) & 1) == 0) {
        *(ulong *)(in_stack_00000020 + local_58 * 8) = local_b0;
        local_58 = local_58 + 1;
      }
      else {
        pdVar3 = tsl::
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::operator[](in_stack_fffffffffffffe70,(unsigned_long *)in_stack_fffffffffffffe68);
        local_70 = *pdVar3;
        dVar7 = fma(*(double *)(local_28 + *(long *)(local_8 + local_b0 * 8) * 8) - local_40,
                    *local_30,*(double *)(local_60 + local_b0 * 8));
        dVar6 = local_70;
        *(double *)(local_60 + local_b0 * 8) = dVar7;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,local_50);
        *pvVar4 = dVar6;
        *(undefined8 *)(in_stack_00000018 + local_50 * 8) =
             *(undefined8 *)(local_28 + *(long *)(local_8 + local_b0 * 8) * 8);
        local_68 = local_70 + local_68;
        local_50 = local_50 + 1;
      }
    }
    local_c8 = local_68 * 0.5;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x25cf21);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe90._M_current,(size_type)in_stack_fffffffffffffe88._M_current,
               (allocator_type *)in_stack_fffffffffffffe80._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x25cf47);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffe68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffe68);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (unsigned_long)in_stack_fffffffffffffe70);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffe68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffe68);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,add_linear_comb_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,double_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (anon_class_8_1_0f1c67a0)in_stack_fffffffffffffe80._M_current);
    local_118 = 0.0;
    lVar8 = in_stack_00000018;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe70);
    *in_stack_00000008 = *(double *)(lVar8 + *pvVar5 * 8);
    for (local_120 = 0; local_120 < local_50; local_120 = local_120 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_e0,local_120);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,*pvVar5);
      local_118 = *pvVar4 + local_118;
      if (local_c8 <= local_118) {
        if (((local_118 != local_c8) || (NAN(local_118) || NAN(local_c8))) ||
           (local_50 - 1 <= local_120)) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_e0,local_120);
          *in_stack_00000008 = *(double *)(in_stack_00000018 + *pvVar5 * 8);
        }
        else {
          lVar8 = in_stack_00000018;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_e0,local_120);
          dVar6 = *(double *)(lVar8 + *pvVar5 * 8);
          lVar8 = in_stack_00000018;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_e0,local_120 + 1);
          in_stack_fffffffffffffe80._M_current = *(unsigned_long **)(lVar8 + *pvVar5 * 8);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_e0,local_120);
          *in_stack_00000008 =
               dVar6 + ((double)in_stack_fffffffffffffe80._M_current -
                       *(double *)(in_stack_00000018 + *pvVar5 * 8)) / 2.0;
        }
        break;
      }
    }
    *in_stack_00000008 = (*in_stack_00000008 - local_40) * *local_30;
    if ((local_58 != 0) && ((*in_stack_00000008 != 0.0 || (NAN(*in_stack_00000008))))) {
      for (local_128 = 0; local_128 < local_58; local_128 = local_128 + 1) {
        lVar8 = *(long *)(in_stack_00000020 + local_128 * 8);
        *(double *)(local_60 + lVar8 * 8) = *in_stack_00000008 + *(double *)(local_60 + lVar8 * 8);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe80._M_current);
  }
  local_bc = 0;
LAB_0025d2ed:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80._M_current);
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}